

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_addvalue(luaL_Buffer *B)

{
  char *__src;
  char *__dest;
  char *b;
  char *s;
  size_t len;
  lua_State *L;
  luaL_Buffer *B_local;
  
  len = (size_t)B->L;
  L = (lua_State *)B;
  __src = lua_tolstring((lua_State *)len,-1,(size_t *)&s);
  __dest = prepbuffsize((luaL_Buffer *)L,(size_t)s,-2);
  memcpy(__dest,__src,(size_t)s);
  (L->top).p = (StkId)(s + (long)(L->top).p);
  lua_settop((lua_State *)len,-2);
  return;
}

Assistant:

LUALIB_API void luaL_addvalue (luaL_Buffer *B) {
  lua_State *L = B->L;
  size_t len;
  const char *s = lua_tolstring(L, -1, &len);
  char *b = prepbuffsize(B, len, -2);
  memcpy(b, s, len * sizeof(char));
  luaL_addsize(B, len);
  lua_pop(L, 1);  /* pop string */
}